

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> __thiscall
slang::parsing::Parser::parseClassSpecifierList(Parser *this,bool allowSpecifiers)

{
  bool bVar1;
  Diagnostic *pDVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  long lVar3;
  bool bVar4;
  SourceRange SVar5;
  string_view sVar6;
  span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL> sVar7;
  Token ok;
  Token sk;
  ClassSpecifierSyntax *specifier;
  SmallVector<slang::syntax::ClassSpecifierSyntax_*,_5UL> specifiers;
  Token local_98;
  Token local_88;
  ClassSpecifierSyntax *local_78;
  SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*> local_70 [2];
  
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  bVar4 = false;
  do {
    bVar1 = ParserBase::peek(&this->super_ParserBase,Colon);
    if (!bVar1) {
      sVar7._M_ptr._0_4_ =
           SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::copy
                     (local_70,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
      sVar7._M_ptr._4_4_ = extraout_var;
      if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
        operator_delete(local_70[0].data_);
      }
      sVar7._M_extent._M_extent_value = extraout_RDX._M_extent_value;
      return sVar7;
    }
    local_78 = parseClassSpecifier(this);
    if (((local_78->keyword).field_0x2 & 1) == 0) {
      if (local_70[0].len == 0 && !allowSpecifiers) {
        SVar5 = slang::syntax::SyntaxNode::sourceRange(&local_78->super_SyntaxNode);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa30005,SVar5);
      }
      if (local_70[0].len != 0) {
        lVar3 = 0;
        do {
          local_88.kind = (local_78->keyword).kind;
          local_88._2_1_ = (local_78->keyword).field_0x2;
          local_88.numFlags.raw = (local_78->keyword).numFlags.raw;
          local_88.rawLen = (local_78->keyword).rawLen;
          local_88.info = (local_78->keyword).info;
          local_98._0_8_ = *(ulong *)(*(long *)((long)local_70[0].data_ + lVar3) + 0x28);
          local_98.info = *(Info **)(*(long *)((long)local_70[0].data_ + lVar3) + 0x30);
          if (local_88.kind == local_98.kind) {
            SVar5 = Token::range(&local_88);
            pDVar2 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x250005,SVar5);
            sVar6 = Token::valueText(&local_88);
            pDVar2 = Diagnostic::operator<<(pDVar2,sVar6);
            SVar5 = Token::range(&local_98);
            Diagnostic::operator<<(pDVar2,SVar5);
            break;
          }
          if (local_98.kind == FinalKeyword) {
            if (!bVar4) {
              SVar5 = Token::range(&local_98);
              bVar4 = true;
              ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x5b0005,SVar5);
              break;
            }
          }
          else if ((local_88.kind != FinalKeyword) && ((local_98._0_8_ & 0x10000) == 0)) {
            SVar5 = Token::range(&local_88);
            pDVar2 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x80005,SVar5);
            sVar6 = Token::valueText(&local_88);
            pDVar2 = Diagnostic::operator<<(pDVar2,sVar6);
            SVar5 = Token::range(&local_98);
            pDVar2 = Diagnostic::operator<<(pDVar2,SVar5);
            sVar6 = Token::valueText(&local_98);
            Diagnostic::operator<<(pDVar2,sVar6);
            break;
          }
          lVar3 = lVar3 + 8;
        } while (local_70[0].len * 8 != lVar3);
      }
    }
    SmallVectorBase<slang::syntax::ClassSpecifierSyntax*>::
    emplace_back<slang::syntax::ClassSpecifierSyntax*const&>
              ((SmallVectorBase<slang::syntax::ClassSpecifierSyntax*> *)local_70,&local_78);
  } while( true );
}

Assistant:

std::span<syntax::ClassSpecifierSyntax*> Parser::parseClassSpecifierList(bool allowSpecifiers) {
    bool erroredOnFinal = false;
    SmallVector<ClassSpecifierSyntax*> specifiers;
    while (peek(TokenKind::Colon)) {
        auto specifier = parseClassSpecifier();
        SLANG_ASSERT(specifier);

        if (!specifier->keyword.isMissing()) {
            if (specifiers.empty() && !allowSpecifiers)
                addDiag(diag::SpecifiersNotAllowed, specifier->sourceRange());

            for (auto other : specifiers) {
                const auto sk = specifier->keyword;
                const auto ok = other->keyword;

                if (sk.kind == ok.kind) {
                    addDiag(diag::DuplicateClassSpecifier, sk.range())
                        << sk.valueText() << ok.range();
                    break;
                }

                if (ok.kind == TokenKind::FinalKeyword && !erroredOnFinal) {
                    erroredOnFinal = true;
                    addDiag(diag::FinalSpecifierLast, ok.range());
                    break;
                }

                if (!ok.isMissing() && ok.kind != TokenKind::FinalKeyword &&
                    sk.kind != TokenKind::FinalKeyword) {
                    addDiag(diag::ClassSpecifierConflict, sk.range())
                        << sk.valueText() << ok.range() << ok.valueText();
                    break;
                }
            }
        }

        specifiers.push_back(specifier);
    }

    return specifiers.copy(alloc);
}